

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O2

void main_loop(void)

{
  string_view trigger;
  long *plVar1;
  size_t sVar2;
  char *pcVar3;
  char cVar4;
  bool bVar5;
  int iVar6;
  ConsoleCommand *pCVar7;
  ostream *poVar8;
  ulong uVar9;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  input_split;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_50;
  
  plVar1 = Jupiter::plugins;
  uVar9 = 0;
  do {
    while( true ) {
      while ((ulong)(plVar1[1] - *plVar1 >> 3) <= uVar9) {
        Jupiter::Timer::check();
        bVar5 = std::mutex::try_lock(&console_input.input_mutex);
        if (bVar5) {
          if (console_input.awaiting_processing == true) {
            console_input.awaiting_processing = false;
            local_60._M_len = 2;
            local_60._M_str = " \t";
            jessilib::
            word_split_once<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_nullptr>
                      (&local_50,&console_input.input,&local_60);
            pcVar3 = local_50.first._M_str;
            sVar2 = local_50.first._M_len;
            trigger._M_str = local_50.first._M_str;
            trigger._M_len = local_50.first._M_len;
            pCVar7 = getConsoleCommand(trigger);
            if (pCVar7 == (ConsoleCommand *)0x0) {
              poVar8 = std::operator<<((ostream *)&std::cout,"Error: Command \"");
              poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar3,sVar2);
              poVar8 = std::operator<<(poVar8,"\" not found.");
              std::endl<char,std::char_traits<char>>(poVar8);
            }
            else {
              (*(pCVar7->super_Command)._vptr_Command[3])
                        (pCVar7,local_50.second._M_len,local_50.second._M_str);
            }
          }
          pthread_mutex_unlock((pthread_mutex_t *)&console_input.input_mutex);
        }
        local_50.first._M_len = 1;
        std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
                  ((duration<long,_std::ratio<1L,_1000L>_> *)&local_50);
        uVar9 = 0;
      }
      cVar4 = Jupiter::Plugin::shouldRemove();
      if (cVar4 == '\0') break;
LAB_001113d7:
      Jupiter::Plugin::free(uVar9);
    }
    iVar6 = (**(code **)**(undefined8 **)(*plVar1 + uVar9 * 8))();
    if (iVar6 != 0) goto LAB_001113d7;
    uVar9 = uVar9 + 1;
  } while( true );
}

Assistant:

[[noreturn]] void main_loop() {
	size_t index;
	while (1) {
		index = 0;
		while (index < Jupiter::plugins.size()) {
			if (Jupiter::plugins[index]->shouldRemove() || Jupiter::plugins[index]->think() != 0) {
				Jupiter::Plugin::free(index);
			}
			else {
				++index;
			}
		}
		Jupiter::Timer::check();

		if (console_input.input_mutex.try_lock()) {
			if (console_input.awaiting_processing) {
				console_input.awaiting_processing = false;
				auto input_split = jessilib::word_split_once_view(console_input.input, WHITESPACE_SV);
				std::string_view command_name = input_split.first;

				ConsoleCommand* command = getConsoleCommand(command_name);
				if (command != nullptr) {
					command->trigger(input_split.second);
				}
				else {
					std::cout << "Error: Command \"" << command_name << "\" not found." << std::endl;
				}
			}
			console_input.input_mutex.unlock();
		}
		std::this_thread::sleep_for((std::chrono::milliseconds(1)));
	}
}